

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datagram_socket_service.hpp
# Opt level: O0

void __thiscall
asio::datagram_socket_service<asio::ip::udp>::destroy
          (datagram_socket_service<asio::ip::udp> *this,implementation_type *impl)

{
  base_implementation_type *in_RDI;
  reactive_socket_service_base *unaff_retaddr;
  
  detail::reactive_socket_service_base::destroy(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void destroy(implementation_type& impl)
  {
    service_impl_.destroy(impl);
  }